

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_load_balancer_attribute.cc
# Opt level: O2

int __thiscall
aliyun::Slb::DescribeLoadBalancerAttribute
          (Slb *this,SlbDescribeLoadBalancerAttributeRequestType *req,
          SlbDescribeLoadBalancerAttributeResponseType *response,SlbErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  int i;
  uint uVar8;
  char *pcVar9;
  Value val;
  undefined1 local_438 [8];
  _Alloc_hider local_430;
  undefined1 local_428 [28];
  allocator<char> local_40c;
  allocator<char> local_40b;
  allocator<char> local_40a;
  allocator<char> local_409;
  Value *local_408;
  string local_400;
  string str_response;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar9 = "http";
  if (this->use_tls_ != false) {
    pcVar9 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar9,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar9 = this->proxy_host_, pcVar9 != (char *)0x0)) &&
     (*pcVar9 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar9,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeLoadBalancerAttribute",(allocator<char> *)&local_400);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)local_438);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)local_438);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)local_438);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"LoadBalancerId",(allocator<char> *)local_438);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->load_balancer_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"OwnerAccount",(allocator<char> *)local_438);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"RegionId",(allocator<char> *)local_438);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,this->region_id_,(allocator<char> *)&local_400);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,anon_var_dwarf_169eda + 9,&local_409);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,anon_var_dwarf_169eda + 9,&local_40a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,anon_var_dwarf_169eda + 9,&local_40b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,anon_var_dwarf_169eda + 9,&local_40c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
      }
      if (response != (SlbDescribeLoadBalancerAttributeResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"LoadBalancerId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"LoadBalancerId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->load_balancer_id,(string *)local_438)
          ;
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"LoadBalancerName");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"LoadBalancerName");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=
                    ((string *)&response->load_balancer_name,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"LoadBalancerStatus");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"LoadBalancerStatus");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=
                    ((string *)&response->load_balancer_status,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"RegionId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RegionId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->region_id,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"RegionIdAlias");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RegionIdAlias");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->region_id_alias,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"Address");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Address");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->address,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"AddressType");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"AddressType");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->address_type,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"VpcId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"VpcId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->vpc_id,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"VSwitchId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"VSwitchId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->vswitch_id,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"NetworkType");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"NetworkType");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->network_type,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"InternetChargeType");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"InternetChargeType");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=
                    ((string *)&response->internet_charge_type,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"Bandwidth");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Bandwidth");
          IVar3 = Json::Value::asInt(pVVar5);
          response->bandwidth = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"SysBandwidth");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"SysBandwidth");
          IVar3 = Json::Value::asInt(pVVar5);
          response->sys_bandwidth = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"CreateTime");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"CreateTime");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->create_time,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"CreateTimeStamp");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"CreateTimeStamp");
          IVar3 = Json::Value::asInt(pVVar5);
          response->create_time_stamp = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"MasterZoneId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"MasterZoneId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->master_zone_id,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"SlaveZoneId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"SlaveZoneId");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->slave_zone_id,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"MaxConnLimit");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"MaxConnLimit");
          IVar3 = Json::Value::asInt(pVVar5);
          response->max_conn_limit = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"SecurityStatus");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"SecurityStatus");
          Json::Value::asString_abi_cxx11_((string *)local_438,pVVar5);
          std::__cxx11::string::operator=((string *)&response->security_status,(string *)local_438);
          std::__cxx11::string::~string((string *)local_438);
        }
        bVar1 = Json::Value::isMember(&val,"ListenerPortsAndProtocal");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ListenerPortsAndProtocal");
          bVar1 = Json::Value::isMember(pVVar5,"ListenerPortAndProtocal");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ListenerPortsAndProtocal");
            pVVar5 = Json::Value::operator[](pVVar5,"ListenerPortAndProtocal");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4; uVar8 = uVar8 + 1) {
                local_430._M_p = local_428 + 8;
                local_428._0_8_ = 0;
                local_428[8] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"ListenerPort");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ListenerPort");
                  IVar3 = Json::Value::asInt(pVVar7);
                  local_438._0_4_ = IVar3;
                }
                bVar1 = Json::Value::isMember(pVVar6,"ListenerProtocal");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"ListenerProtocal");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_430,(string *)&local_400);
                  std::__cxx11::string::~string((string *)&local_400);
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocalType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocalType>_>
                ::push_back(&response->listener_ports_and_protocal,(value_type *)local_438);
                std::__cxx11::string::~string((string *)&local_430);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"ListenerPortsAndProtocol");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ListenerPortsAndProtocol");
          bVar1 = Json::Value::isMember(pVVar5,"ListenerPortAndProtocol");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ListenerPortsAndProtocol");
            pVVar5 = Json::Value::operator[](pVVar5,"ListenerPortAndProtocol");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4; uVar8 = uVar8 + 1) {
                local_430._M_p = local_428 + 8;
                local_428._0_8_ = 0;
                local_428[8] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"ListenerPort");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ListenerPort");
                  IVar3 = Json::Value::asInt(pVVar7);
                  local_438._0_4_ = IVar3;
                }
                bVar1 = Json::Value::isMember(pVVar6,"ListenerProtocol");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"ListenerProtocol");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_430,(string *)&local_400);
                  std::__cxx11::string::~string((string *)&local_400);
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocolType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocolType>_>
                ::push_back(&response->listener_ports_and_protocol,(value_type *)local_438);
                std::__cxx11::string::~string((string *)&local_430);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"BackendServers");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"BackendServers");
          bVar1 = Json::Value::isMember(pVVar5,"BackendServer");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"BackendServers");
            local_408 = Json::Value::operator[](pVVar5,"BackendServer");
            bVar1 = Json::Value::isArray(local_408);
            if (bVar1) {
              pVVar5 = local_408;
              for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4; uVar8 = uVar8 + 1) {
                local_438 = (undefined1  [8])local_428;
                local_430._M_p = (pointer)0x0;
                local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"ServerId");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar6,"ServerId");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
                  std::__cxx11::string::operator=((string *)local_438,(string *)&local_400);
                  pVVar5 = local_408;
                  std::__cxx11::string::~string((string *)&local_400);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Weight");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"Weight");
                  local_428._16_4_ = Json::Value::asInt(pVVar6);
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeBackendServerType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeBackendServerType>_>
                ::push_back(&response->backend_servers,(value_type *)local_438);
                std::__cxx11::string::~string((string *)local_438);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"ListenerPorts");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ListenerPorts");
          bVar1 = Json::Value::isMember(pVVar5,"ListenerPort");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ListenerPorts");
            pVVar5 = Json::Value::operator[](pVVar5,"ListenerPort");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4; uVar8 = uVar8 + 1) {
                local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
                local_400._M_string_length = 0;
                local_400.field_2._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                Json::Value::asString_abi_cxx11_((string *)local_438,pVVar6);
                std::__cxx11::string::operator=((string *)&local_400,(string *)local_438);
                std::__cxx11::string::~string((string *)local_438);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&response->listener_ports,&local_400);
                std::__cxx11::string::~string((string *)&local_400);
              }
            }
          }
        }
      }
      goto LAB_0013a583;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013a583:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::DescribeLoadBalancerAttribute(const SlbDescribeLoadBalancerAttributeRequestType& req,
                      SlbDescribeLoadBalancerAttributeResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeLoadBalancerAttribute");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}